

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  xmlParserInputBufferPtr input;
  setDocumentLocatorSAXFunc p_Var4;
  startDocumentSAXFunc p_Var5;
  endElementSAXFunc p_Var6;
  __int32_t *p_Var7;
  xmlChar *pxVar8;
  endDocumentSAXFunc p_Var9;
  byte bVar10;
  int iVar11;
  xmlParserInputState xVar12;
  uint uVar13;
  int iVar14;
  size_t sVar15;
  byte *pbVar16;
  xmlSAXLocator *pxVar17;
  void *pvVar18;
  long lVar19;
  __int32_t **pp_Var20;
  _xmlSAXHandler *p_Var21;
  charactersSAXFunc p_Var22;
  xmlDtdPtr pxVar23;
  xmlChar xVar24;
  xmlChar *pxVar25;
  char *pcVar26;
  xmlParserErrors error;
  code *in_R8;
  xmlChar *pxVar27;
  xmlParserInputPtr pxVar28;
  bool bVar29;
  bool bVar30;
  htmlParserNodeInfo node_info;
  ushort local_62;
  void *local_60;
  htmlParserNodeInfo local_58;
  
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (pxVar28 = ctxt->input, pxVar28 == (xmlParserInputPtr)0x0)
     ) {
    pcVar26 = "htmlParseChunk: context error\n";
    iVar11 = 1;
    error = XML_ERR_INTERNAL_ERROR;
LAB_0014d1e0:
    htmlParseErr(ctxt,error,pcVar26,(xmlChar *)0x0,(xmlChar *)0x0);
    return iVar11;
  }
  if (((chunk == (char *)0x0 || size < 1) || (pxVar28->buf == (xmlParserInputBufferPtr)0x0)) ||
     (ctxt->instate == XML_PARSER_EOF)) {
    if (((ctxt->instate != XML_PARSER_EOF) &&
        (input = pxVar28->buf, input != (xmlParserInputBufferPtr)0x0)) &&
       ((input->encoder != (xmlCharEncodingHandlerPtr)0x0 &&
        ((input->buffer != (xmlBufPtr)0x0 && (input->raw != (xmlBufPtr)0x0)))))) {
      sVar15 = xmlBufGetInputBase(input->buffer,pxVar28);
      pxVar27 = ctxt->input->cur;
      pxVar25 = ctxt->input->base;
      iVar11 = xmlCharEncInput(input,terminate);
      xmlBufSetInputBaseCur(input->buffer,ctxt->input,sVar15,(long)pxVar27 - (long)pxVar25);
      if (iVar11 < 0) {
        pcVar26 = "encoder error\n";
        iVar11 = 0x51;
        error = XML_ERR_INVALID_ENCODING;
        goto LAB_0014d1e0;
      }
    }
  }
  else {
    sVar15 = xmlBufGetInputBase(pxVar28->buf->buffer,pxVar28);
    pxVar28 = ctxt->input;
    pxVar27 = pxVar28->cur;
    pxVar25 = pxVar28->base;
    iVar11 = xmlParserInputBufferPush(pxVar28->buf,size,chunk);
    xmlBufSetInputBaseCur(ctxt->input->buf->buffer,ctxt->input,sVar15,(long)pxVar27 - (long)pxVar25)
    ;
    if (iVar11 < 0) {
      ctxt->errNo = -1;
      ctxt->disableSAX = 1;
      return -1;
    }
  }
  pxVar28 = ctxt->input;
  if (pxVar28 == (xmlParserInputPtr)0x0) {
    bVar30 = true;
    goto LAB_0014e00b;
  }
LAB_0014d268:
  if (pxVar28->buf == (xmlParserInputBufferPtr)0x0) {
    sVar15 = (size_t)pxVar28->length;
  }
  else {
    sVar15 = xmlBufUse(pxVar28->buf->buffer);
  }
  pxVar27 = pxVar28->base + (sVar15 - (long)pxVar28->cur);
  if ((((terminate != 0) && (pxVar27 == (xmlChar *)0x0)) &&
      (htmlAutoCloseOnEnd(ctxt), ctxt->nameNr == 0)) && (ctxt->instate != XML_PARSER_EOF)) {
    ctxt->instate = XML_PARSER_EOF;
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
      (*p_Var9)(ctxt->userData);
    }
  }
  pxVar25 = pxVar27;
  if ((long)pxVar27 < 1) goto switchD_0014d2db_caseD_ffffffff;
  pbVar16 = pxVar28->cur;
  if (*pbVar16 == 0) {
    pxVar28 = ctxt->input;
    ppxVar1 = &pxVar28->cur;
    *ppxVar1 = *ppxVar1 + 1;
    piVar2 = &pxVar28->col;
    *piVar2 = *piVar2 + 1;
    goto LAB_0014d632;
  }
  if (0x11 < (uint)(ctxt->instate + XML_PARSER_MISC)) goto LAB_0014d632;
  uVar13 = (uint)*pbVar16;
  pxVar25 = &DAT_00000001;
  switch(ctxt->instate) {
  case XML_PARSER_START:
    if ((uVar13 < 0x21) && ((0x100002600U >> ((ulong)uVar13 & 0x3f) & 1) != 0)) {
      htmlSkipBlankChars(ctxt);
      if (pxVar28->buf == (xmlParserInputBufferPtr)0x0) {
        sVar15 = (size_t)pxVar28->length;
      }
      else {
        sVar15 = xmlBufUse(pxVar28->buf->buffer);
      }
      pxVar27 = pxVar28->base + (sVar15 - (long)pxVar28->cur);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var4 = ctxt->sax->setDocumentLocator, p_Var4 != (setDocumentLocatorSAXFunc)0x0)) {
      local_60 = ctxt->userData;
      pxVar17 = __xmlDefaultSAXLocator();
      (*p_Var4)(local_60,pxVar17);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var5 = ctxt->sax->startDocument, p_Var5 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var5)(ctxt->userData);
    }
    if ((*pxVar28->cur == '<') && (pxVar28->cur[1] == '!')) {
      pp_Var20 = __ctype_toupper_loc();
      p_Var7 = *pp_Var20;
      pxVar25 = ctxt->input->cur;
      if ((((p_Var7[pxVar25[2]] != 0x44) ||
           ((p_Var7[pxVar25[3]] != 0x4f || (p_Var7[pxVar25[4]] != 0x43)))) ||
          (p_Var7[pxVar25[5]] != 0x54)) ||
         (((p_Var7[pxVar25[6]] != 0x59 || (p_Var7[pxVar25[7]] != 0x50)) ||
          (p_Var7[pxVar25[8]] != 0x45)))) goto LAB_0014da3f;
      if (terminate == 0) {
        iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8);
        pxVar25 = pxVar27;
joined_r0x0014d7ac:
        if (iVar11 < 0) goto switchD_0014d2db_caseD_ffffffff;
      }
LAB_0014da32:
      htmlParseDocTypeDecl(ctxt);
      goto LAB_0014d856;
    }
    goto LAB_0014da3f;
  case XML_PARSER_MISC:
    htmlSkipBlankChars(ctxt);
    if (pxVar28->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar28->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar28->buf->buffer);
    }
    pxVar27 = pxVar28->base + (sVar15 - (long)pxVar28->cur);
    pxVar25 = pxVar27;
    if ((long)pxVar27 < 1) goto switchD_0014d2db_caseD_ffffffff;
    if (pxVar27 == &DAT_00000001) {
      xVar24 = ' ';
      pxVar25 = &DAT_00000001;
      if (terminate == 0) goto switchD_0014d2db_caseD_ffffffff;
    }
    else {
      xVar24 = pxVar28->cur[1];
    }
    pxVar25 = pxVar28->cur;
    bVar30 = *pxVar25 != '<';
    bVar29 = xVar24 != '!';
    if (((bVar29 || bVar30) || (pxVar25[2] != '-')) || (pxVar25[3] != '-')) {
      if ((*pxVar25 != '<') || (xVar24 != '?')) {
        if (!bVar29 && !bVar30) {
          pp_Var20 = __ctype_toupper_loc();
          p_Var7 = *pp_Var20;
          pxVar25 = ctxt->input->cur;
          if (((p_Var7[pxVar25[2]] == 0x44) && (p_Var7[pxVar25[3]] == 0x4f)) &&
             ((p_Var7[pxVar25[4]] == 0x43 &&
              ((((p_Var7[pxVar25[5]] == 0x54 && (p_Var7[pxVar25[6]] == 0x59)) &&
                (p_Var7[pxVar25[7]] == 0x50)) && (p_Var7[pxVar25[8]] == 0x45)))))) {
            if (terminate == 0) {
              iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8);
              pxVar25 = &DAT_00000001;
              goto joined_r0x0014d7ac;
            }
            goto LAB_0014da32;
          }
        }
        pxVar25 = &DAT_00000001;
        if (8 < (long)pxVar27 || (bVar29 || bVar30)) goto LAB_0014d874;
        goto switchD_0014d2db_caseD_ffffffff;
      }
      if ((terminate == 0) &&
         (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), pxVar25 = &DAT_00000001,
         iVar11 < 0)) goto switchD_0014d2db_caseD_ffffffff;
      htmlParsePI(ctxt);
    }
    else {
      if ((terminate == 0) &&
         (iVar11 = htmlParseLookupCommentEnd(ctxt), pxVar25 = &DAT_00000001, iVar11 < 0))
      goto switchD_0014d2db_caseD_ffffffff;
      htmlParseComment(ctxt);
    }
LAB_0014da3f:
    ctxt->instate = XML_PARSER_MISC;
    goto LAB_0014d632;
  case XML_PARSER_PI:
    pcVar26 = "HPP: internal error, state == PI\n";
    break;
  case XML_PARSER_DTD:
    pcVar26 = "HPP: internal error, state == DTD\n";
    break;
  case XML_PARSER_PROLOG:
    htmlSkipBlankChars(ctxt);
    if (pxVar28->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar28->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar28->buf->buffer);
    }
    pxVar27 = pxVar28->base + (sVar15 - (long)pxVar28->cur);
    pxVar25 = pxVar27;
    if (1 < (long)pxVar27) {
      pbVar16 = pxVar28->cur;
      bVar3 = pbVar16[1];
      bVar10 = *pbVar16 ^ 0x3c;
      if (((bVar3 != 0x21 || bVar10 != 0) || (pbVar16[2] != 0x2d)) || (pbVar16[3] != 0x2d)) {
        if (bVar10 != 0 || bVar3 != 0x3f) {
          pxVar25 = &DAT_00000001;
          if (3 < (long)pxVar27 || (bVar3 != 0x21 || bVar10 != 0)) goto LAB_0014d874;
          goto switchD_0014d2db_caseD_ffffffff;
        }
        if ((terminate == 0) &&
           (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), pxVar25 = &DAT_00000001
           , iVar11 < 0)) goto switchD_0014d2db_caseD_ffffffff;
        htmlParsePI(ctxt);
      }
      else {
        if ((terminate == 0) &&
           (iVar11 = htmlParseLookupCommentEnd(ctxt), pxVar25 = &DAT_00000001, iVar11 < 0))
        goto switchD_0014d2db_caseD_ffffffff;
        htmlParseComment(ctxt);
      }
LAB_0014d856:
      ctxt->instate = XML_PARSER_PROLOG;
      goto LAB_0014d632;
    }
    goto switchD_0014d2db_caseD_ffffffff;
  case XML_PARSER_COMMENT:
    pcVar26 = "HPP: internal error, state == COMMENT\n";
    break;
  case XML_PARSER_START_TAG:
    if (pxVar27 == &DAT_00000001) {
      if (terminate == 0) goto switchD_0014d2db_caseD_ffffffff;
      bVar30 = false;
    }
    else {
      bVar30 = pbVar16[1] == 0x2f;
    }
    if (uVar13 == 0x3c) {
      if (bVar30) {
        ctxt->instate = XML_PARSER_END_TAG;
        goto LAB_0014d627;
      }
      if ((terminate == 0) &&
         (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), iVar11 < 0))
      goto switchD_0014d2db_caseD_ffffffff;
      if (ctxt->record_info != 0) {
        pxVar28 = ctxt->input;
        local_58.begin_pos =
             (unsigned_long)(pxVar28->cur + (pxVar28->consumed - (long)pxVar28->base));
        local_58.begin_line = (unsigned_long)pxVar28->line;
      }
      iVar11 = htmlParseStartTag(ctxt);
      pxVar25 = ctxt->name;
      if (pxVar25 == (xmlChar *)0x0 || iVar11 == -1) {
        if (*ctxt->input->cur == '>') {
          xmlNextChar(ctxt);
        }
        goto LAB_0014d632;
      }
      in_R8 = htmlCompareTags;
      pvVar18 = bsearch(pxVar25,html40ElementTable,0x5c,0x40,htmlCompareTags);
      if (pvVar18 == (void *)0x0) {
        in_R8 = (code *)0x0;
        htmlParseErr(ctxt,XML_HTML_UNKNOWN_TAG,"Tag %s invalid\n",pxVar25,(xmlChar *)0x0);
      }
      pxVar28 = ctxt->input;
      pxVar8 = pxVar28->cur;
      if (*pxVar8 == '>') {
        xmlNextChar(ctxt);
        if ((pvVar18 != (void *)0x0) && (*(char *)((long)pvVar18 + 0xb) != '\0')) {
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var6 = ctxt->sax->endElement, p_Var6 != (endElementSAXFunc)0x0)) {
            (*p_Var6)(ctxt->userData,pxVar25);
          }
LAB_0014de5f:
          iVar11 = ctxt->nameNr;
          lVar19 = (long)iVar11;
          if (0 < lVar19) {
            ctxt->nameNr = iVar11 + -1;
            if (iVar11 == 1) {
              pxVar25 = (xmlChar *)0x0;
            }
            else {
              pxVar25 = ctxt->nameTab[lVar19 + -2];
            }
            ctxt->name = pxVar25;
            ctxt->nameTab[lVar19 + -1] = (xmlChar *)0x0;
          }
        }
      }
      else {
        if ((*pxVar8 == '/') && (pxVar8[1] == '>')) {
          pxVar28->cur = pxVar8 + 2;
          pxVar28->col = pxVar28->col + 2;
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var6 = ctxt->sax->endElement, p_Var6 != (endElementSAXFunc)0x0)) {
            (*p_Var6)(ctxt->userData,pxVar25);
          }
          iVar11 = ctxt->nameNr;
          lVar19 = (long)iVar11;
          if (0 < lVar19) {
            ctxt->nameNr = iVar11 + -1;
            if (iVar11 == 1) {
              pxVar25 = (xmlChar *)0x0;
            }
            else {
              pxVar25 = ctxt->nameTab[lVar19 + -2];
            }
            ctxt->name = pxVar25;
            ctxt->nameTab[lVar19 + -1] = (xmlChar *)0x0;
          }
          goto LAB_0014d874;
        }
        in_R8 = (code *)0x0;
        htmlParseErr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",pxVar25,
                     (xmlChar *)0x0);
        iVar11 = xmlStrEqual(pxVar25,ctxt->name);
        if (iVar11 != 0) {
          nodePop(ctxt);
          goto LAB_0014de5f;
        }
      }
      if (ctxt->record_info != 0) {
        htmlNodeInfoPush(ctxt,&local_58);
      }
    }
LAB_0014d874:
    ctxt->instate = XML_PARSER_CONTENT;
    goto LAB_0014d632;
  case XML_PARSER_CONTENT:
    local_62 = 0;
    if (ctxt->token != 0) {
      local_62 = (ushort)(byte)ctxt->token;
      htmlCheckParagraph(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var22 = ctxt->sax->characters, p_Var22 != (charactersSAXFunc)0x0)) {
        (*p_Var22)(ctxt->userData,(xmlChar *)&local_62,1);
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
    }
    if ((((terminate == 0) || (pxVar27 != &DAT_00000001)) || (bVar3 = *pxVar28->cur, bVar3 == 0x26))
       || (bVar3 == 0x3c)) {
      iVar11 = 4;
      if (pxVar27 != &DAT_00000001) {
        local_60 = (void *)CONCAT71(local_60._1_7_,*pxVar28->cur);
        bVar3 = pxVar28->cur[1];
        iVar11 = xmlStrEqual(ctxt->name,"script");
        if ((iVar11 == 0) && (iVar11 = xmlStrEqual(ctxt->name,"style"), iVar11 == 0)) {
          bVar10 = (byte)local_60 ^ 0x3c;
          if (bVar3 == 0x21 && bVar10 == 0) {
            pp_Var20 = __ctype_toupper_loc();
            p_Var7 = *pp_Var20;
            pxVar8 = ctxt->input->cur;
            if (((p_Var7[pxVar8[2]] == 0x44) && (p_Var7[pxVar8[3]] == 0x4f)) &&
               ((p_Var7[pxVar8[4]] == 0x43 &&
                ((((p_Var7[pxVar8[5]] == 0x54 && (p_Var7[pxVar8[6]] == 0x59)) &&
                  (p_Var7[pxVar8[7]] == 0x50)) && (p_Var7[pxVar8[8]] == 0x45)))))) {
              if (terminate == 0) {
                iVar14 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8);
                iVar11 = 4;
                if (iVar14 < 0) goto LAB_0014ddd8;
              }
              in_R8 = (code *)0x0;
              htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                           (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
              htmlParseDocTypeDecl(ctxt);
            }
            else {
              if ((pxVar28->cur[2] == '-') && (pxVar28->cur[3] == '-')) {
                if (terminate == 0) {
                  iVar14 = htmlParseLookupCommentEnd(ctxt);
                  iVar11 = 4;
                  if (iVar14 < 0) goto LAB_0014ddd8;
                }
                htmlParseComment(ctxt);
                goto LAB_0014dd5f;
              }
              if (terminate == 0) {
                iVar14 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8);
                iVar11 = 4;
                if (iVar14 < 0) goto LAB_0014ddd8;
              }
              htmlSkipBogusComment(ctxt);
            }
          }
          else if (bVar3 == 0x3f && bVar10 == 0) {
            if (terminate == 0) {
              iVar14 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8);
              iVar11 = 4;
              if (iVar14 < 0) goto LAB_0014ddd8;
            }
            htmlParsePI(ctxt);
LAB_0014dd5f:
            ctxt->instate = XML_PARSER_CONTENT;
          }
          else {
            iVar11 = 4;
            if (bVar10 != 0 || bVar3 != 0x2f) {
              if ((byte)local_60 == 0x3c) {
                if (0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) {
                  if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
                     (p_Var22 = ctxt->sax->characters, p_Var22 != (charactersSAXFunc)0x0)) {
                    (*p_Var22)(ctxt->userData,"<",1);
                  }
                  xmlNextChar(ctxt);
                  goto LAB_0014ddd3;
                }
                if ((terminate != 0) || (bVar3 != 0)) {
                  ctxt->instate = XML_PARSER_START_TAG;
                  goto LAB_0014ded5;
                }
              }
              else {
                if (terminate == 0) {
                  iVar14 = htmlParseLookupSequence(ctxt,'<','\0','\0',(int)in_R8);
                  iVar11 = 4;
                  if (iVar14 < 0) goto LAB_0014ddd8;
                }
                ctxt->checkIndex = 0;
                iVar11 = 5;
                if (ctxt->instate != XML_PARSER_EOF) {
                  xVar24 = (byte)local_60;
                  while (iVar11 = 5, pxVar28->cur < pxVar28->end) {
                    if (xVar24 == '&') {
                      htmlParseReference(ctxt);
                    }
                    else {
                      htmlParseCharData(ctxt);
                    }
                    iVar11 = 5;
                    if ((ctxt->instate == XML_PARSER_EOF) || (xVar24 = *pxVar28->cur, xVar24 == '<')
                       ) break;
                  }
                }
              }
              goto LAB_0014ddd8;
            }
            ctxt->instate = XML_PARSER_END_TAG;
LAB_0014ded5:
            ctxt->checkIndex = 0;
          }
          goto LAB_0014ddd3;
        }
        if (terminate == 0) {
          uVar13 = htmlParseLookupSequence(ctxt,'<','/','\0',(int)in_R8);
          if ((int)uVar13 < 0) {
            iVar11 = 4;
            bVar30 = false;
          }
          else {
            bVar29 = pxVar28->cur[(ulong)uVar13 + 2] == '\0';
            bVar30 = !bVar29;
            iVar11 = (uint)bVar29 << 2;
          }
          if (!bVar30) goto LAB_0014ddd8;
        }
        htmlParseScript(ctxt);
        iVar11 = 5;
        if (bVar3 == 0x2f && (byte)local_60 == '<') {
          ctxt->instate = XML_PARSER_END_TAG;
          ctxt->checkIndex = 0;
        }
      }
    }
    else {
      p_Var21 = ctxt->sax;
      if (p_Var21 != (_xmlSAXHandler *)0x0) {
        local_62 = CONCAT11(local_62._1_1_,bVar3);
        if ((bVar3 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)) {
          if (ctxt->keepBlanks != 0) goto LAB_0014dd9e;
          p_Var22 = p_Var21->ignorableWhitespace;
        }
        else {
          htmlCheckParagraph(ctxt);
          p_Var21 = ctxt->sax;
LAB_0014dd9e:
          p_Var22 = p_Var21->characters;
        }
        if (p_Var22 != (charactersSAXFunc)0x0) {
          (*p_Var22)(ctxt->userData,(xmlChar *)&local_62,1);
        }
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
      pxVar28->cur = pxVar28->cur + 1;
LAB_0014ddd3:
      iVar11 = 5;
    }
LAB_0014ddd8:
    if (iVar11 == 5) goto LAB_0014d632;
    if (iVar11 != 4) goto LAB_0014e0a8;
    goto switchD_0014d2db_caseD_ffffffff;
  case XML_PARSER_CDATA_SECTION:
    pcVar26 = "HPP: internal error, state == CDATA\n";
    break;
  case XML_PARSER_END_TAG:
    if ((pxVar27 != &DAT_00000001) &&
       ((terminate != 0 ||
        (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar11)))) {
      htmlParseEndTag(ctxt);
      xVar12 = XML_PARSER_CONTENT;
      if (ctxt->nameNr == 0) {
        xVar12 = XML_PARSER_EPILOG;
      }
      ctxt->instate = xVar12;
      goto LAB_0014d627;
    }
    goto switchD_0014d2db_caseD_ffffffff;
  case XML_PARSER_ENTITY_DECL:
    pcVar26 = "HPP: internal error, state == ENTITY_DECL\n";
    break;
  case XML_PARSER_ENTITY_VALUE:
    pcVar26 = "HPP: internal error, state == ENTITY_VALUE\n";
    break;
  case XML_PARSER_ATTRIBUTE_VALUE:
    in_R8 = (code *)0x0;
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"HPP: internal error, state == ATTRIBUTE_VALUE\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    ctxt->instate = XML_PARSER_START_TAG;
    goto LAB_0014d627;
  case XML_PARSER_SYSTEM_LITERAL:
    pcVar26 = "HPP: internal error, state == XML_PARSER_SYSTEM_LITERAL\n";
    break;
  case XML_PARSER_EPILOG:
    if (pxVar28->buf == (xmlParserInputBufferPtr)0x0) {
      sVar15 = (size_t)pxVar28->length;
    }
    else {
      sVar15 = xmlBufUse(pxVar28->buf->buffer);
      pbVar16 = pxVar28->cur;
    }
    pxVar27 = pxVar28->base + (sVar15 - (long)pbVar16);
    pxVar25 = pxVar27;
    if (0 < (long)pxVar27) {
      pbVar16 = pxVar28->cur;
      bVar3 = *pbVar16;
      if (((ulong)bVar3 < 0x21) && ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
        htmlParseCharData(ctxt);
LAB_0014e12b:
        bVar30 = false;
        goto LAB_0014e00b;
      }
      pxVar25 = &DAT_00000001;
      if (pxVar27 != &DAT_00000001) {
        bVar10 = pbVar16[1];
        if (((bVar10 != 0x21 || bVar3 != 0x3c) || (pbVar16[2] != 0x2d)) || (pbVar16[3] != 0x2d)) {
          if ((bVar3 != 0x3c) || (bVar10 != 0x3f)) {
            if (3 < (long)pxVar27 || (bVar10 != 0x21 || bVar3 != 0x3c)) {
              ctxt->errNo = 5;
              ctxt->wellFormed = 0;
              ctxt->instate = XML_PARSER_EOF;
              if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                 (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
                (*p_Var9)(ctxt->userData);
              }
            }
            goto LAB_0014e12b;
          }
          if ((terminate == 0) &&
             (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), iVar11 < 0))
          goto switchD_0014d2db_caseD_ffffffff;
          htmlParsePI(ctxt);
        }
        else {
          if ((terminate == 0) && (iVar11 = htmlParseLookupCommentEnd(ctxt), iVar11 < 0))
          goto switchD_0014d2db_caseD_ffffffff;
          htmlParseComment(ctxt);
        }
        ctxt->instate = XML_PARSER_EPILOG;
        goto LAB_0014d632;
      }
    }
    goto switchD_0014d2db_caseD_ffffffff;
  case XML_PARSER_IGNORE:
    pcVar26 = "HPP: internal error, state == XML_PARSER_IGNORE\n";
    break;
  case XML_PARSER_PUBLIC_LITERAL:
    pcVar26 = "HPP: internal error, state == XML_PARSER_LITERAL\n";
    break;
  case XML_PARSER_EOF:
    goto switchD_0014d2db_caseD_ffffffff;
  }
  in_R8 = (code *)0x0;
  htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,pcVar26,(xmlChar *)0x0,(xmlChar *)0x0);
  ctxt->instate = XML_PARSER_CONTENT;
LAB_0014d627:
  ctxt->checkIndex = 0;
LAB_0014d632:
  pxVar28 = ctxt->input;
  pxVar25 = pxVar27;
  if (pxVar28 == (xmlParserInputPtr)0x0) goto switchD_0014d2db_caseD_ffffffff;
  goto LAB_0014d268;
switchD_0014d2db_caseD_ffffffff:
  bVar30 = pxVar25 == (xmlChar *)0x0;
LAB_0014e00b:
  if (((terminate != 0) && (bVar30)) &&
     ((htmlAutoCloseOnEnd(ctxt), ctxt->nameNr == 0 && (ctxt->instate != XML_PARSER_EOF)))) {
    ctxt->instate = XML_PARSER_EOF;
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
      (*p_Var9)(ctxt->userData);
    }
  }
  if (((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
      ((terminate != 0 ||
       ((ctxt->instate == XML_PARSER_EPILOG || (ctxt->instate == XML_PARSER_EOF)))))) &&
     (pxVar23 = xmlGetIntSubset(ctxt->myDoc), pxVar23 == (xmlDtdPtr)0x0)) {
    pxVar23 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                 (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                 (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
    ctxt->myDoc->intSubset = pxVar23;
  }
LAB_0014e0a8:
  if (terminate != 0) {
    xVar12 = ctxt->instate;
    if (xVar12 != XML_PARSER_EOF) {
      if ((xVar12 != XML_PARSER_MISC) && (xVar12 != XML_PARSER_EPILOG)) {
        ctxt->errNo = 5;
        ctxt->wellFormed = 0;
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
        (*p_Var9)(ctxt->userData);
      }
    }
    ctxt->instate = XML_PARSER_EOF;
  }
  return ctxt->errNo;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseChunk: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    ctxt->disableSAX = 1;
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "HPP: pushed %d\n", size);
#endif

#if 0
	if ((terminate) || (ctxt->input->buf->buffer->use > 80))
	    htmlParseTryOrFinish(ctxt, terminate);
#endif
    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
			         "encoder error\n", NULL, NULL);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    htmlParseTryOrFinish(ctxt, terminate);
    if (terminate) {
	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG) &&
	    (ctxt->instate != XML_PARSER_MISC)) {
	    ctxt->errNo = XML_ERR_DOCUMENT_END;
	    ctxt->wellFormed = 0;
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    return((xmlParserErrors) ctxt->errNo);
}